

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int yang_check_deviate_must
              (lys_module *module,unres_schema *unres,lys_deviate *deviate,lys_node *dev_target)

{
  byte *pbVar1;
  char *pcVar2;
  LYS_NODE LVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  char *pcVar12;
  LY_ERR *pLVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lStack_50;
  
  LVar3 = dev_target->nodetype;
  lStack_50 = 0x1f;
  bVar9 = true;
  if (((LVar3 != LYS_ANYDATA) && (LVar3 != LYS_LEAF)) && (LVar3 != LYS_LEAFLIST)) {
    if (LVar3 == LYS_LIST) {
      lStack_50 = 0x1c;
    }
    else if (LVar3 != LYS_ANYXML) {
      if (LVar3 != LYS_CONTAINER) {
        ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"must");
        ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Target node does not allow \"must\" property.");
        goto LAB_00149d42;
      }
      lStack_50 = 0x1e;
    }
  }
  pbVar1 = (byte *)((long)&dev_target->flags + 1);
  *pbVar1 = *pbVar1 & 0xfd;
  if (deviate->mod == LY_DEVIATE_ADD) {
    pcVar12 = (char *)ly_realloc(dev_target[1].dsc,
                                 ((ulong)dev_target->padding[lStack_50 + -0x1c] +
                                 (ulong)deviate->must_size) * 0x38);
    if (pcVar12 == (char *)0x0) {
      pLVar13 = ly_errno_location();
      *pLVar13 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_check_deviate_must");
LAB_00149d3e:
      bVar9 = true;
      goto LAB_00149d42;
    }
    dev_target[1].dsc = pcVar12;
    memcpy(pcVar12 + (ulong)dev_target->padding[lStack_50 + -0x1c] * 0x38,deviate->must,
           (ulong)deviate->must_size * 0x38);
    free(deviate->must);
    deviate->must = (lys_restr *)(pcVar12 + (ulong)dev_target->padding[lStack_50 + -0x1c] * 0x38);
    dev_target->padding[lStack_50 + -0x1c] =
         dev_target->padding[lStack_50 + -0x1c] + deviate->must_size;
    bVar9 = false;
  }
  else if (deviate->mod == LY_DEVIATE_DEL) {
    for (uVar16 = 0; bVar9 = true, uVar16 < deviate->must_size; uVar16 = uVar16 + 1) {
      lVar15 = 0;
      while( true ) {
        if ((ulong)dev_target->padding[lStack_50 + -0x1c] * 0x38 - lVar15 == 0) {
          ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,deviate->must[uVar16 & 0xffffffff].expr,"must")
          ;
          ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Value does not match any must from the target."
                 );
          goto LAB_00149d3e;
        }
        if (deviate->must[uVar16].expr == *(char **)(dev_target[1].dsc + lVar15)) break;
        lVar15 = lVar15 + 0x38;
      }
      lys_restr_free(module->ctx,(lys_restr *)(dev_target[1].dsc + lVar15));
      bVar10 = dev_target->padding[lStack_50 + -0x1c] - 1;
      dev_target->padding[lStack_50 + -0x1c] = bVar10;
      if ((ulong)bVar10 * 0x38 - lVar15 != 0) {
        pcVar12 = dev_target[1].dsc;
        lVar14 = (ulong)bVar10 * 0x38;
        *(undefined8 *)(pcVar12 + lVar15 + 0x30) = *(undefined8 *)(pcVar12 + lVar14 + 0x30);
        uVar4 = *(undefined8 *)(pcVar12 + lVar14);
        uVar5 = *(undefined8 *)(pcVar12 + lVar14 + 8);
        uVar6 = *(undefined8 *)(pcVar12 + lVar14 + 0x10);
        uVar7 = *(undefined8 *)(pcVar12 + lVar14 + 0x10 + 8);
        uVar8 = *(undefined8 *)(pcVar12 + lVar14 + 0x20 + 8);
        *(undefined8 *)(pcVar12 + lVar15 + 0x20) = *(undefined8 *)(pcVar12 + lVar14 + 0x20);
        *(undefined8 *)(pcVar12 + lVar15 + 0x20 + 8) = uVar8;
        *(undefined8 *)(pcVar12 + lVar15 + 0x10) = uVar6;
        *(undefined8 *)(pcVar12 + lVar15 + 0x10 + 8) = uVar7;
        *(undefined8 *)(pcVar12 + lVar15) = uVar4;
        *(undefined8 *)(pcVar12 + lVar15 + 8) = uVar5;
        bVar10 = dev_target->padding[lStack_50 + -0x1c];
      }
      pcVar12 = dev_target[1].dsc;
      if (bVar10 == 0) {
        free(pcVar12);
        dev_target[1].dsc = (char *)0x0;
      }
      else {
        lVar15 = (ulong)bVar10 * 0x38;
        pcVar2 = pcVar12 + lVar15 + 0x20;
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
        pcVar2[8] = '\0';
        pcVar2[9] = '\0';
        pcVar2[10] = '\0';
        pcVar2[0xb] = '\0';
        pcVar2[0xc] = '\0';
        pcVar2[0xd] = '\0';
        pcVar2[0xe] = '\0';
        pcVar2[0xf] = '\0';
        pcVar2 = pcVar12 + lVar15 + 0x10;
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
        pcVar2[8] = '\0';
        pcVar2[9] = '\0';
        pcVar2[10] = '\0';
        pcVar2[0xb] = '\0';
        pcVar2[0xc] = '\0';
        pcVar2[0xd] = '\0';
        pcVar2[0xe] = '\0';
        pcVar2[0xf] = '\0';
        pcVar2 = pcVar12 + lVar15;
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
        pcVar2[8] = '\0';
        pcVar2[9] = '\0';
        pcVar2[10] = '\0';
        pcVar2[0xb] = '\0';
        pcVar2[0xc] = '\0';
        pcVar2[0xd] = '\0';
        pcVar2[0xe] = '\0';
        pcVar2[0xf] = '\0';
        pcVar12 = pcVar12 + lVar15 + 0x30;
        pcVar12[0] = '\0';
        pcVar12[1] = '\0';
        pcVar12[2] = '\0';
        pcVar12[3] = '\0';
        pcVar12[4] = '\0';
        pcVar12[5] = '\0';
        pcVar12[6] = '\0';
        pcVar12[7] = '\0';
      }
    }
  }
  iVar11 = yang_check_must(module,deviate->must,(uint)deviate->must_size,unres);
  if (iVar11 == 0) {
    if (dev_target->padding[lStack_50 + -0x1c] == '\0') {
      return 0;
    }
    iVar11 = unres_schema_add_node(module,unres,dev_target,UNRES_XPATH,(lys_node *)0x0);
    if (iVar11 == 0) {
      return 0;
    }
  }
LAB_00149d42:
  if ((bVar9) && (deviate->mod == LY_DEVIATE_ADD)) {
    lVar15 = 0;
    for (uVar16 = 0; uVar16 < deviate->must_size; uVar16 = uVar16 + 1) {
      lys_restr_free(module->ctx,(lys_restr *)((long)&deviate->must->expr + lVar15));
      lVar15 = lVar15 + 0x38;
    }
    free(deviate->must);
  }
  return 1;
}

Assistant:

int
yang_check_deviate_must(struct lys_module *module, struct unres_schema *unres,
                        struct lys_deviate *deviate, struct lys_node *dev_target)
{
    int i, j, erase_must = 1;
    struct lys_restr **trg_must, *must;
    uint8_t *trg_must_size;

    /* check target node type */
    switch (dev_target->nodetype) {
        case LYS_LEAF:
            trg_must = &((struct lys_node_leaf *)dev_target)->must;
            trg_must_size = &((struct lys_node_leaf *)dev_target)->must_size;
            break;
        case LYS_CONTAINER:
            trg_must = &((struct lys_node_container *)dev_target)->must;
            trg_must_size = &((struct lys_node_container *)dev_target)->must_size;
            break;
        case LYS_LEAFLIST:
            trg_must = &((struct lys_node_leaflist *)dev_target)->must;
            trg_must_size = &((struct lys_node_leaflist *)dev_target)->must_size;
            break;
        case LYS_LIST:
            trg_must = &((struct lys_node_list *)dev_target)->must;
            trg_must_size = &((struct lys_node_list *)dev_target)->must_size;
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            trg_must = &((struct lys_node_anydata *)dev_target)->must;
            trg_must_size = &((struct lys_node_anydata *)dev_target)->must_size;
            break;
        default:
            LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "must");
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Target node does not allow \"must\" property.");
            goto error;
    }

    /* flag will be checked again, clear it for now */
    dev_target->flags &= ~LYS_XPATH_DEP;

    if (deviate->mod == LY_DEVIATE_ADD) {
        /* reallocate the must array of the target */
        must = ly_realloc(*trg_must, (deviate->must_size + *trg_must_size) * sizeof *must);
        if (!must) {
            LOGMEM;
            goto error;
        }
        *trg_must = must;
        memcpy(&(*trg_must)[*trg_must_size], deviate->must, deviate->must_size * sizeof *must);
        free(deviate->must);
        deviate->must = &must[*trg_must_size];
        *trg_must_size = *trg_must_size + deviate->must_size;
        erase_must = 0;
    } else if (deviate->mod == LY_DEVIATE_DEL) {
        /* find must to delete, we are ok with just matching conditions */
        for (j = 0; j < deviate->must_size; ++j) {
            for (i = 0; i < *trg_must_size; i++) {
                if (ly_strequal(deviate->must[j].expr, (*trg_must)[i].expr, 1)) {
                    /* we have a match, free the must structure ... */
                    lys_restr_free(module->ctx, &((*trg_must)[i]));
                    /* ... and maintain the array */
                    (*trg_must_size)--;
                    if (i != *trg_must_size) {
                        memcpy(&(*trg_must)[i], &(*trg_must)[*trg_must_size], sizeof *must);
                    }
                    if (!(*trg_must_size)) {
                        free(*trg_must);
                        *trg_must = NULL;
                    } else {
                        memset(&(*trg_must)[*trg_must_size], 0, sizeof *must);
                    }

                    i = -1; /* set match flag */
                    break;
                }
            }
            if (i != -1) {
                /* no match found */
                LOGVAL(LYE_INARG, LY_VLOG_NONE, NULL, deviate->must[j].expr, "must");
                LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Value does not match any must from the target.");
                goto error;
            }
        }
    }

    if (yang_check_must(module, deviate->must, deviate->must_size, unres)) {
        goto error;
    }
    /* check XPath dependencies */
    if (*trg_must_size && unres_schema_add_node(module, unres, dev_target, UNRES_XPATH, NULL)) {
        goto error;
    }

    return EXIT_SUCCESS;
error:
    if (deviate->mod == LY_DEVIATE_ADD && erase_must) {
        for (i = 0; i < deviate->must_size; ++i) {
            lys_restr_free(module->ctx, &deviate->must[i]);
        }
        free(deviate->must);
    }
    return EXIT_FAILURE;
}